

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_grow_predicted<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>(int iters)

{
  int in_EDI;
  size_t finish;
  double ut;
  int i;
  size_t start;
  Rusage t;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff48;
  HashObject<8,_8> *in_stack_ffffffffffffff50;
  Rusage *in_stack_ffffffffffffff60;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *in_stack_ffffffffffffff70;
  int local_84;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  double in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            (in_stack_ffffffffffffff70);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff50);
  CurrentMemoryUsage();
  google::
  sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff50);
  for (local_84 = 0; local_84 < in_EDI; local_84 = local_84 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    in_stack_ffffffffffffff50 =
         (HashObject<8,_8> *)
         google::
         sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::operator[]((sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                       *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50->i_ = local_84 + 1;
  }
  Rusage::UserTime(in_stack_ffffffffffffff60);
  CurrentMemoryUsage();
  report(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
         in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d70e6);
  return;
}

Assistant:

static void time_map_grow_predicted(int iters) {
  MapType set;
  Rusage t;

  const size_t start = CurrentMemoryUsage();
  set.resize(iters);
  t.Reset();
  for (int i = 0; i < iters; i++) {
    set[i] = i + 1;
  }
  double ut = t.UserTime();
  const size_t finish = CurrentMemoryUsage();
  report("map_predict/grow", ut, iters, start, finish);
}